

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int *piVar2;
  ImVec4 *pIVar3;
  int iVar4;
  ImGuiColorMod *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiContext *pIVar12;
  ImGuiColorMod *__dest;
  int iVar13;
  ImGuiContext *ctx;
  int iVar14;
  ImVec4 IVar15;
  
  pIVar12 = GImGui;
  pIVar3 = (GImGui->Style).Colors + idx;
  fVar8 = pIVar3->x;
  fVar9 = pIVar3->y;
  fVar10 = pIVar3->z;
  fVar11 = pIVar3->w;
  iVar14 = (GImGui->ColorStack).Size;
  iVar4 = (GImGui->ColorStack).Capacity;
  if (iVar14 == iVar4) {
    iVar14 = iVar14 + 1;
    if (iVar4 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar4 / 2 + iVar4;
    }
    if (iVar14 < iVar13) {
      iVar14 = iVar13;
    }
    if (iVar4 < iVar14) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x14,GImAllocatorUserData);
      pIVar5 = (pIVar12->ColorStack).Data;
      if (pIVar5 != (ImGuiColorMod *)0x0) {
        memcpy(__dest,pIVar5,(long)(pIVar12->ColorStack).Size * 0x14);
        pIVar5 = (pIVar12->ColorStack).Data;
        if ((pIVar5 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar12->ColorStack).Data = __dest;
      (pIVar12->ColorStack).Capacity = iVar14;
    }
  }
  pIVar5 = (pIVar12->ColorStack).Data;
  iVar14 = (pIVar12->ColorStack).Size;
  pIVar5[iVar14].Col = idx;
  pIVar1 = &pIVar5[iVar14].BackupValue;
  pIVar1->x = fVar8;
  pIVar1->y = fVar9;
  pIVar1->z = fVar10;
  pIVar1->w = fVar11;
  (pIVar12->ColorStack).Size = (pIVar12->ColorStack).Size + 1;
  auVar6 = vpinsrd_avx(ZEXT416(col),col >> 8,1);
  auVar6 = vpand_avx(auVar6,_DAT_00547840);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpinsrd_avx(ZEXT416(col >> 0x10 & 0xff),col >> 0x18,1);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar6 = vmovlhps_avx(auVar6,auVar7);
  auVar7._8_4_ = 0x3b808081;
  auVar7._0_8_ = 0x3b8080813b808081;
  auVar7._12_4_ = 0x3b808081;
  IVar15 = (ImVec4)vmulps_avx512vl(auVar6,auVar7);
  *pIVar3 = IVar15;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}